

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# macro.c
# Opt level: O1

void fini_macrodis(void)

{
  free(mcr_parm);
  mcr_parm = (char *)0x0;
  free(mcr_mov);
  mcr_mov = (char *)0x0;
  free(mcr_maddr);
  mcr_maddr = (char *)0x0;
  free(mcr_send);
  mcr_send = (char *)0x0;
  free(mcr_exit);
  mcr_exit = (char *)0x0;
  free(mcr_add);
  mcr_add = (char *)0x0;
  free(mcr_adc);
  mcr_adc = (char *)0x0;
  free(mcr_sub);
  mcr_sub = (char *)0x0;
  free(mcr_sbb);
  mcr_sbb = (char *)0x0;
  free(mcr_and);
  mcr_and = (char *)0x0;
  free(mcr_andn);
  mcr_andn = (char *)0x0;
  free(mcr_nand);
  mcr_nand = (char *)0x0;
  free(mcr_or);
  mcr_or = (char *)0x0;
  free(mcr_xor);
  mcr_xor = (char *)0x0;
  free(mcr_read);
  mcr_read = (char *)0x0;
  free(mcr_bra);
  mcr_bra = (char *)0x0;
  free(mcr_braz);
  mcr_braz = (char *)0x0;
  free(mcr_branz);
  mcr_branz = (char *)0x0;
  free(mcr_mthd);
  mcr_mthd = (char *)0x0;
  free(mcr_incr);
  mcr_incr = (char *)0x0;
  free(mcr_nop);
  mcr_nop = (char *)0x0;
  free(mcr_annul);
  mcr_annul = (char *)0x0;
  free(mcr_extrshl);
  mcr_extrshl = (char *)0x0;
  free(mcr_extrinsrt);
  mcr_extrinsrt = (char *)0x0;
  free(mcr_parmsend);
  mcr_parmsend = (char *)0x0;
  free(mcr_maddrsend);
  mcr_maddrsend = (char *)0x0;
  return;
}

Assistant:

static void fini_str(char **c)
{
	free(*c);
	*c = NULL;
}